

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::deleteRenderbuffers
          (ReferenceContext *this,int numRenderbuffers,deUint32 *renderbuffers)

{
  Renderbuffer *renderbuffer;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)numRenderbuffers;
  if (numRenderbuffers < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    if (renderbuffers[uVar1] != 0) {
      renderbuffer = rc::ObjectManager<sglr::rc::Renderbuffer>::find
                               (&this->m_renderbuffers,renderbuffers[uVar1]);
      if (renderbuffer != (Renderbuffer *)0x0) {
        deleteRenderbuffer(this,renderbuffer);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::deleteRenderbuffers (int numRenderbuffers, const deUint32* renderbuffers)
{
	for (int i = 0; i < numRenderbuffers; i++)
	{
		deUint32		name			= renderbuffers[i];
		Renderbuffer*	renderbuffer	= name ? m_renderbuffers.find(name) : DE_NULL;

		if (renderbuffer)
			deleteRenderbuffer(renderbuffer);
	}
}